

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_id.c
# Opt level: O2

void csp_id2_prepend(csp_packet_t *packet)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = (ulong)(packet->id).dport << 0xc | (ulong)(packet->id).src << 0x12;
  uVar4 = uVar3 | (ulong)(packet->id).dst << 0x20 | (ulong)(packet->id).pri << 0x2e;
  uVar1 = (ulong)(packet->id).flags | (ulong)(packet->id).sport << 6;
  uVar2 = uVar1 | uVar4;
  packet->frame_begin = packet->header + 2;
  packet->frame_length = packet->length + 6;
  *(ushort *)(packet->header + 6) = (ushort)(uVar2 >> 8) & 0xff | (ushort)((uVar1 << 0x38) >> 0x30);
  *(uint *)(packet->header + 2) =
       ((uint)(uVar4 >> 0x20) & 0xff00) >> 8 | (uint)(uVar4 >> 0x18) & 0xff00 |
       (uint)(uVar2 >> 8) & 0xff0000 | (uint)(((uVar3 & 0xff0000) << 0x18) >> 0x10);
  return;
}

Assistant:

static void csp_id2_prepend(csp_packet_t * packet) {

	/* Pack into 64-bit using host endian */
	uint64_t id2 = ((((uint64_t)packet->id.pri) << CSP_ID2_PRIO_OFFSET) |
					(((uint64_t)packet->id.dst) << CSP_ID2_DST_OFFSET) |
					(((uint64_t)packet->id.src) << CSP_ID2_SRC_OFFSET) |
					(packet->id.dport << CSP_ID2_DPORT_OFFSET) |
					(packet->id.sport << CSP_ID2_SPORT_OFFSET) |
					(packet->id.flags << CSP_ID2_FLAGS_OFFSET));

	/* Convert to big / network endian:
	 * We first shift up the 48 bit header to most significant end of the 64-bit */
	id2 = htobe64(id2 << 16);

	packet->frame_begin = packet->data - CSP_ID2_HEADER_SIZE;
	packet->frame_length = packet->length + CSP_ID2_HEADER_SIZE;

	memcpy(packet->frame_begin, &id2, CSP_ID2_HEADER_SIZE);
}